

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msat.hpp
# Opt level: O0

SAT * __thiscall CompoundFile::MSAT::buildSAT(MSAT *this)

{
  bool bVar1;
  istream *in_RSI;
  SAT *in_RDI;
  const_iterator last;
  const_iterator it;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> sat;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *in_stack_ffffffffffffff68;
  fpos<__mbstate_t> *in_stack_ffffffffffffff70;
  SAT *sat_00;
  undefined8 local_58;
  undefined8 local_50;
  __normal_iterator<const_CompoundFile::SecID_*,_std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>_>
  local_30 [6];
  
  sat_00 = in_RDI;
  std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::vector
            ((vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)0x1544eb);
  std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::begin
            (in_stack_ffffffffffffff68);
  __gnu_cxx::
  __normal_iterator<CompoundFile::SecID_const*,std::vector<CompoundFile::SecID,std::allocator<CompoundFile::SecID>>>
  ::__normal_iterator<CompoundFile::SecID*>
            ((__normal_iterator<const_CompoundFile::SecID_*,_std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>_>
              *)in_stack_ffffffffffffff70,
             (__normal_iterator<CompoundFile::SecID_*,_std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>_>
              *)in_stack_ffffffffffffff68);
  std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::end
            (in_stack_ffffffffffffff68);
  __gnu_cxx::
  __normal_iterator<CompoundFile::SecID_const*,std::vector<CompoundFile::SecID,std::allocator<CompoundFile::SecID>>>
  ::__normal_iterator<CompoundFile::SecID*>
            ((__normal_iterator<const_CompoundFile::SecID_*,_std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>_>
              *)in_stack_ffffffffffffff70,
             (__normal_iterator<CompoundFile::SecID_*,_std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>_>
              *)in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_CompoundFile::SecID_*,_std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<const_CompoundFile::SecID_*,_std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    in_stack_ffffffffffffff70 = *(fpos<__mbstate_t> **)(in_RSI + 8);
    __gnu_cxx::
    __normal_iterator<const_CompoundFile::SecID_*,_std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>_>
    ::operator*(local_30);
    Header::sectorSize(*(Header **)in_RSI);
    calcFileOffset((SecID *)in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
    std::fpos<__mbstate_t>::fpos(in_stack_ffffffffffffff70,(streamoff)in_stack_ffffffffffffff68);
    std::istream::seekg(in_stack_ffffffffffffff70,local_58,local_50);
    in_stack_ffffffffffffff68 =
         *(vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> **)(in_RSI + 8);
    Header::sectorSize(*(Header **)in_RSI);
    loadSATSector(in_RSI,&sat_00->m_sat,(int32_t)((ulong)in_RDI >> 0x20));
    __gnu_cxx::
    __normal_iterator<const_CompoundFile::SecID_*,_std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>_>
    ::operator++(local_30);
  }
  SAT::SAT((SAT *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::~vector(&in_RDI->m_sat);
  return sat_00;
}

Assistant:

inline SAT
MSAT::buildSAT()
{
	std::vector< SecID > sat;

	for( std::vector< SecID >::const_iterator it = m_msat.begin(),
		last = m_msat.end(); it != last; ++it )
	{
		m_stream.seekg( calcFileOffset( *it, m_header.sectorSize() ) );

		loadSATSector( m_stream, sat, m_header.sectorSize() );
	}

	return SAT( sat );
}